

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O2

void __thiscall Potassco::RuleBuilder::startBody(RuleBuilder *this,Body_t bt,Weight_t bnd)

{
  uint32_t uVar1;
  Rule *r;
  uint uVar2;
  Weight_t bnd_local;
  
  r = (Rule *)(this->mem_).beg_;
  uVar2 = *(uint *)r;
  bnd_local = bnd;
  if ((int)uVar2 < 0) {
    r->head = (Span)0x0;
    r->body = (Span)0x0;
    *(undefined4 *)r = 0x14;
    uVar2 = 0x14;
  }
  else {
    uVar1 = (r->body).mend;
    if (uVar1 != 0) {
      if (uVar1 == (*(uint *)&r->body & 0x3fffffff)) {
        return;
      }
      fail(-1,"void Potassco::RuleBuilder::startBody(Body_t, Weight_t)",0x91,"r->body.len() == 0",
           "Invalid second call to startBody()",0);
    }
  }
  if (bt.val_ != Normal) {
    r = anon_unknown_21::push<int>(&this->mem_,r,&bnd_local);
    uVar2 = *(uint *)r;
  }
  (r->body).mend = uVar2 & 0x7fffffff;
  *(E *)&r->body = bt.val_ << 0x1e | uVar2 & 0x3fffffff;
  return;
}

Assistant:

void RuleBuilder::startBody(Body_t bt, Weight_t bnd) {
	Rule* r = unfreeze(true);
	if (!r->body.mend) {
		if (bt != Body_t::Normal) { r = push(mem_, r, bnd); }
		r->body.init(r->top, bt);
	}
	else {
		POTASSCO_ASSERT(r->body.len() == 0, "Invalid second call to startBody()");
	}
}